

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DExporter.cpp
# Opt level: O1

void __thiscall
Assimp::X3DExporter::AttrHelper_Col4DArrToString
          (X3DExporter *this,aiColor4D *pArray,size_t pArray_Size,string *pTargetString)

{
  size_type sVar1;
  pointer pcVar2;
  string *psVar3;
  long *plVar4;
  undefined8 *puVar5;
  ulong *puVar6;
  long *plVar7;
  size_type sVar8;
  string *__range2;
  ulong uVar9;
  undefined8 uVar10;
  float *pfVar11;
  ulong *local_1a0;
  long local_198;
  ulong local_190;
  long lStack_188;
  long *local_180;
  undefined8 local_178;
  long local_170;
  undefined8 uStack_168;
  long *local_160;
  undefined8 local_158;
  long local_150;
  undefined8 uStack_148;
  long *local_140;
  undefined8 local_138;
  long local_130;
  undefined8 uStack_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  ulong *local_c0;
  long local_b8;
  ulong local_b0;
  long lStack_a8;
  ulong *local_a0;
  long local_98;
  ulong local_90;
  long lStack_88;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  string *local_60;
  size_t local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pTargetString->_M_string_length = 0;
  *(pTargetString->_M_dataplus)._M_p = '\0';
  local_60 = pTargetString;
  std::__cxx11::string::reserve((ulong)pTargetString);
  if (pArray_Size != 0) {
    pfVar11 = &pArray->a;
    do {
      local_58 = pArray_Size;
      __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                (&local_50,vsnprintf,0x3a,"%f",SUB84((double)((aiColor4D *)(pfVar11 + -3))->r,0));
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_1a0 = &local_190;
      puVar6 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar6) {
        local_190 = *puVar6;
        lStack_188 = plVar4[3];
      }
      else {
        local_190 = *puVar6;
        local_1a0 = (ulong *)*plVar4;
      }
      local_198 = plVar4[1];
      *plVar4 = (long)puVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                (&local_e0,vsnprintf,0x3a,"%f",SUB84((double)pfVar11[-2],0));
      uVar9 = 0xf;
      if (local_1a0 != &local_190) {
        uVar9 = local_190;
      }
      if (uVar9 < local_e0._M_string_length + local_198) {
        uVar10 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          uVar10 = local_e0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar10 < local_e0._M_string_length + local_198) goto LAB_006b20fe;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_e0,0,(char *)0x0,(ulong)local_1a0);
      }
      else {
LAB_006b20fe:
        puVar5 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_1a0,(ulong)local_e0._M_dataplus._M_p);
      }
      local_180 = &local_170;
      plVar4 = puVar5 + 2;
      if ((long *)*puVar5 == plVar4) {
        local_170 = *plVar4;
        uStack_168 = puVar5[3];
      }
      else {
        local_170 = *plVar4;
        local_180 = (long *)*puVar5;
      }
      local_178 = puVar5[1];
      *puVar5 = plVar4;
      puVar5[1] = 0;
      *(undefined1 *)plVar4 = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_180);
      puVar6 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar6) {
        local_b0 = *puVar6;
        lStack_a8 = plVar4[3];
        local_c0 = &local_b0;
      }
      else {
        local_b0 = *puVar6;
        local_c0 = (ulong *)*plVar4;
      }
      local_b8 = plVar4[1];
      *plVar4 = (long)puVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                (&local_100,vsnprintf,0x3a,"%f",SUB84((double)pfVar11[-1],0));
      uVar9 = 0xf;
      if (local_c0 != &local_b0) {
        uVar9 = local_b0;
      }
      if (uVar9 < local_100._M_string_length + local_b8) {
        uVar10 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != &local_100.field_2) {
          uVar10 = local_100.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar10 < local_100._M_string_length + local_b8) goto LAB_006b2245;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_100,0,(char *)0x0,(ulong)local_c0);
      }
      else {
LAB_006b2245:
        puVar5 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_c0,(ulong)local_100._M_dataplus._M_p);
      }
      local_160 = &local_150;
      plVar4 = puVar5 + 2;
      if ((long *)*puVar5 == plVar4) {
        local_150 = *plVar4;
        uStack_148 = puVar5[3];
      }
      else {
        local_150 = *plVar4;
        local_160 = (long *)*puVar5;
      }
      local_158 = puVar5[1];
      *puVar5 = plVar4;
      puVar5[1] = 0;
      *(undefined1 *)plVar4 = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_160);
      puVar6 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar6) {
        local_90 = *puVar6;
        lStack_88 = plVar4[3];
        local_a0 = &local_90;
      }
      else {
        local_90 = *puVar6;
        local_a0 = (ulong *)*plVar4;
      }
      local_98 = plVar4[1];
      *plVar4 = (long)puVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                (&local_120,vsnprintf,0x3a,"%f",SUB84((double)*pfVar11,0));
      uVar9 = 0xf;
      if (local_a0 != &local_90) {
        uVar9 = local_90;
      }
      if (uVar9 < local_120._M_string_length + local_98) {
        uVar10 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p != &local_120.field_2) {
          uVar10 = local_120.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar10 < local_120._M_string_length + local_98) goto LAB_006b238c;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_120,0,(char *)0x0,(ulong)local_a0);
      }
      else {
LAB_006b238c:
        puVar5 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_a0,(ulong)local_120._M_dataplus._M_p);
      }
      local_140 = &local_130;
      plVar4 = puVar5 + 2;
      if ((long *)*puVar5 == plVar4) {
        local_130 = *plVar4;
        uStack_128 = puVar5[3];
      }
      else {
        local_130 = *plVar4;
        local_140 = (long *)*puVar5;
      }
      local_138 = puVar5[1];
      *puVar5 = plVar4;
      puVar5[1] = 0;
      *(undefined1 *)plVar4 = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_140);
      local_80 = &local_70;
      plVar7 = plVar4 + 2;
      if ((long *)*plVar4 == plVar7) {
        local_70 = *plVar7;
        lStack_68 = plVar4[3];
      }
      else {
        local_70 = *plVar7;
        local_80 = (long *)*plVar4;
      }
      local_78 = plVar4[1];
      *plVar4 = (long)plVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::_M_append((char *)local_60,(ulong)local_80);
      if (local_80 != &local_70) {
        operator_delete(local_80,local_70 + 1);
      }
      if (local_140 != &local_130) {
        operator_delete(local_140,local_130 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
      }
      if (local_a0 != &local_90) {
        operator_delete(local_a0,local_90 + 1);
      }
      if (local_160 != &local_150) {
        operator_delete(local_160,local_150 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      }
      if (local_c0 != &local_b0) {
        operator_delete(local_c0,local_b0 + 1);
      }
      if (local_180 != &local_170) {
        operator_delete(local_180,local_170 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
      if (local_1a0 != &local_190) {
        operator_delete(local_1a0,local_190 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      pfVar11 = pfVar11 + 4;
      pArray_Size = local_58 - 1;
    } while (pArray_Size != 0);
  }
  psVar3 = local_60;
  std::__cxx11::string::resize((ulong)local_60,(char)local_60->_M_string_length + -1);
  sVar1 = psVar3->_M_string_length;
  if (sVar1 != 0) {
    pcVar2 = (psVar3->_M_dataplus)._M_p;
    sVar8 = 0;
    do {
      if (pcVar2[sVar8] == ',') {
        pcVar2[sVar8] = '.';
      }
      sVar8 = sVar8 + 1;
    } while (sVar1 != sVar8);
  }
  return;
}

Assistant:

void X3DExporter::AttrHelper_Col4DArrToString(const aiColor4D* pArray, const size_t pArray_Size, string& pTargetString)
{
	pTargetString.clear();
	pTargetString.reserve(pArray_Size * 8);// (Number + space) * 4.
	for(size_t idx = 0; idx < pArray_Size; idx++)
		pTargetString.append(to_string(pArray[idx].r) + " " + to_string(pArray[idx].g) + " " + to_string(pArray[idx].b) + " " +
								to_string(pArray[idx].a) + " ");

	// remove last space symbol.
	pTargetString.resize(pTargetString.length() - 1);
	AttrHelper_CommaToPoint(pTargetString);
}